

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_file.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ReadFileBind<duckdb::ReadTextOperation>
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  _Head_base<0UL,_duckdb::ReadFileBindData_*,_false> _Var1;
  ClientContext *context_00;
  reference pvVar2;
  MultiFileList *pMVar3;
  pointer pRVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  _Head_base<0UL,_duckdb::ReadFileBindData_*,_false> local_50;
  shared_ptr<duckdb::MultiFileList,_true> local_48;
  _Head_base<0UL,_duckdb::MultiFileReader_*,_false> local_38;
  
  make_uniq<duckdb::ReadFileBindData>();
  MultiFileReader::Create((MultiFileReader *)&local_38,input->table_function);
  context_00 = (ClientContext *)
               unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
               ::operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                             *)&local_38);
  pvVar2 = vector<duckdb::Value,_true>::get<true>(input->inputs,0);
  MultiFileReader::CreateFileList
            ((MultiFileReader *)&local_48,context_00,(Value *)context,(FileGlobOptions)pvVar2);
  pMVar3 = shared_ptr<duckdb::MultiFileList,_true>::operator->(&local_48);
  (*pMVar3->_vptr_MultiFileList[4])(&local_70,pMVar3);
  pRVar4 = unique_ptr<duckdb::ReadFileBindData,_std::default_delete<duckdb::ReadFileBindData>,_true>
           ::operator->((unique_ptr<duckdb::ReadFileBindData,_std::default_delete<duckdb::ReadFileBindData>,_true>
                         *)&local_50);
  ::std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::_M_move_assign
            ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)&pRVar4->files,
             &local_70);
  ::std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
            ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)&local_70);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.internal.
              super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  LogicalType::LogicalType((LogicalType *)&local_70,VARCHAR);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>
            (&return_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             (LogicalType *)&local_70);
  LogicalType::~LogicalType((LogicalType *)&local_70);
  ::std::__cxx11::string::string((string *)&local_70,"filename",(allocator *)&local_48);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  ReadTextOperation::TYPE();
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>
            (&return_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             (LogicalType *)&local_70);
  LogicalType::~LogicalType((LogicalType *)&local_70);
  ::std::__cxx11::string::string((string *)&local_70,"content",(allocator *)&local_48);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  LogicalType::LogicalType((LogicalType *)&local_70,BIGINT);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>
            (&return_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             (LogicalType *)&local_70);
  LogicalType::~LogicalType((LogicalType *)&local_70);
  ::std::__cxx11::string::string((string *)&local_70,"size",(allocator *)&local_48);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  LogicalType::LogicalType((LogicalType *)&local_70,TIMESTAMP_TZ);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>
            (&return_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             (LogicalType *)&local_70);
  LogicalType::~LogicalType((LogicalType *)&local_70);
  ::std::__cxx11::string::string((string *)&local_70,"last_modified",(allocator *)&local_48);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  _Var1._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (ReadFileBindData *)0x0;
  *(ReadFileBindData **)this = _Var1._M_head_impl;
  if (local_38._M_head_impl != (MultiFileReader *)0x0) {
    (*(local_38._M_head_impl)->_vptr_MultiFileReader[1])();
    if (local_50._M_head_impl != (ReadFileBindData *)0x0) {
      (*((local_50._M_head_impl)->super_TableFunctionData).super_FunctionData._vptr_FunctionData[1])
                ();
    }
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> ReadFileBind(ClientContext &context, TableFunctionBindInput &input,
                                             vector<LogicalType> &return_types, vector<string> &names) {
	auto result = make_uniq<ReadFileBindData>();

	auto multi_file_reader = MultiFileReader::Create(input.table_function);
	result->files =
	    multi_file_reader->CreateFileList(context, input.inputs[0], FileGlobOptions::ALLOW_EMPTY)->GetAllFiles();

	return_types.push_back(LogicalType::VARCHAR);
	names.push_back("filename");
	return_types.push_back(OP::TYPE());
	names.push_back("content");
	return_types.push_back(LogicalType::BIGINT);
	names.push_back("size");
	return_types.push_back(LogicalType::TIMESTAMP_TZ);
	names.push_back("last_modified");

	return std::move(result);
}